

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

void Abc_NtkDeleteObj_rec(Abc_Obj_t *pObj,int fOnlyNodes)

{
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11a,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 2) {
    if ((pObj->vFanouts).nSize == 0) {
      vNodes = Vec_PtrAlloc((int)pObj);
      Abc_NodeCollectFanins(pObj,vNodes);
      Abc_NtkDeleteObj(pObj);
      if (fOnlyNodes == 0) {
        for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
          pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar2);
          if (((*(uint *)&pAVar1->field_0x14 & 0xf) != 2) && ((pAVar1->vFanouts).nSize == 0)) {
            Abc_NtkDeleteObj_rec(pAVar1,0);
          }
        }
      }
      else {
        for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
          pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar2);
          if (((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) && ((pAVar1->vFanouts).nSize == 0)) {
            Abc_NtkDeleteObj_rec(pAVar1,fOnlyNodes);
          }
        }
      }
      Vec_PtrFree(vNodes);
      return;
    }
    __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11c,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  __assert_fail("!Abc_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x11b,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
}

Assistant:

void Abc_NtkDeleteObj_rec( Abc_Obj_t * pObj, int fOnlyNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsPi(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    if ( fOnlyNodes )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    else
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( !Abc_ObjIsPi(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    Vec_PtrFree( vNodes );
}